

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::CaseInsensitiveMatchAndConsume(void)

{
  bool bVar1;
  StringPiece sp;
  string text;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  StringPiece local_1e0;
  char *local_1d0;
  int local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  LogMessageFatal local_190;
  
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_1d0,"A fish named *Wanda*",(allocator *)&local_190);
  local_1e0.ptr_ = local_1d0;
  local_1e0.length_ = local_1c8;
  RE2::RE2((RE2 *)&local_190,"(?i)([wand]{5})");
  local_1e8 = &local_1b0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*>(&local_1e0,(RE2 *)&local_190,&local_1e8);
  RE2::~RE2((RE2 *)&local_190);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4ce);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(sp, \"(?i)([wand]{5})\", &result)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  RE2::RE2((RE2 *)&local_190,"(?i)([wand]{5})");
  local_1e8 = &local_1b0;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>(&local_1e0,(RE2 *)&local_190,&local_1e8);
  RE2::~RE2((RE2 *)&local_190);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4cf);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: RE2::FindAndConsume(&sp, \"(?i)([wand]{5})\", &result)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}